

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maths.c
# Opt level: O0

void vec4_normalize_this(vec4 v)

{
  float fStack_18;
  float l;
  vec4 v_local;
  
  fStack_18 = v.x;
  l = v.y;
  v_local.x = v.z;
  v_local.y = v.w;
  sqrtf(v_local.y * v_local.y + v_local.x * v_local.x + fStack_18 * fStack_18 + l * l);
  return;
}

Assistant:

void vec4_normalize_this(vec4 v) {
    float l = sqrtf(v.x * v.x + v.y * v.y + v.z * v.z + v.w * v.w);
    if (l != 0) {
        v.x /= l;
        v.y /= l;
        v.z /= l;
        v.w /= l;
    }
}